

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

double ClipperLib::Area(OutRec *outRec,bool UseFullInt64Range)

{
  OutPt **ppOVar1;
  IntPoint *pIVar2;
  IntPoint *pIVar3;
  OutPt *pOVar4;
  ulong uVar5;
  ulong uVar6;
  OutPt *pOVar7;
  bool bVar8;
  double a;
  double dVar9;
  Int128 local_a8;
  long local_90;
  long local_88;
  Int128 local_80;
  Int128 local_70;
  long local_60;
  long local_58;
  Int128 local_50;
  Int128 local_40;
  
  pOVar7 = outRec->pts;
  if (pOVar7 == (OutPt *)0x0) {
    dVar9 = 0.0;
  }
  else {
    if (UseFullInt64Range) {
      local_a8.hi = 0;
      local_a8.lo = 0;
      do {
        local_50.lo = (pOVar7->prev->pt).X;
        local_50.hi = local_50.lo >> 0x3f;
        local_58 = (pOVar7->pt).Y;
        local_60 = local_58 >> 0x3f;
        Int128::operator*(&local_40,&local_50);
        local_80.lo = (pOVar7->pt).X;
        local_80.hi = local_80.lo >> 0x3f;
        local_88 = (pOVar7->prev->pt).Y;
        local_90 = local_88 >> 0x3f;
        Int128::operator*(&local_70,&local_80);
        uVar5 = ~local_70.hi;
        if (local_70.lo == 0) {
          uVar5 = -local_70.hi;
        }
        uVar6 = local_40.lo - local_70.lo;
        local_a8.hi = local_a8.hi + local_40.hi + uVar5 + (ulong)(uVar6 < (ulong)-local_70.lo);
        bVar8 = CARRY8(local_a8.lo,uVar6);
        local_a8.lo = local_a8.lo + uVar6;
        if (bVar8) {
          local_a8.hi = local_a8.hi + 1;
        }
        pOVar7 = pOVar7->next;
      } while (pOVar7 != outRec->pts);
      dVar9 = Int128::AsDouble(&local_a8);
    }
    else {
      dVar9 = 0.0;
      pOVar4 = pOVar7;
      do {
        ppOVar1 = &pOVar4->prev;
        pIVar3 = &pOVar4->pt;
        pIVar2 = &pOVar4->pt;
        pOVar4 = pOVar4->next;
        dVar9 = dVar9 + (double)(pIVar3->Y * ((*ppOVar1)->pt).X - ((*ppOVar1)->pt).Y * pIVar2->X);
      } while (pOVar4 != pOVar7);
    }
    dVar9 = dVar9 * 0.5;
  }
  return dVar9;
}

Assistant:

double Area(const OutRec &outRec, bool UseFullInt64Range)
{
  if (!outRec.pts)
    return 0.0;

  OutPt *op = outRec.pts;
  if (UseFullInt64Range) {
    Int128 a(0);
    do {
      a += (Int128(op->prev->pt.X) * Int128(op->pt.Y)) -
        Int128(op->pt.X) * Int128(op->prev->pt.Y);
      op = op->next;
    } while (op != outRec.pts);
    return a.AsDouble() / 2;
  }
  else
  {
    double a = 0;
    do {
      a += (op->prev->pt.X * op->pt.Y) - (op->pt.X * op->prev->pt.Y);
      op = op->next;
    } while (op != outRec.pts);
    return a/2;
  }
}